

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall minibag::Player::doKeepAlive(Player *this)

{
  bool bVar1;
  int iVar2;
  Time *rhs;
  TimeTranslator *in_RDI;
  WallDuration *in_stack_00000008;
  TimePublisher *in_stack_00000010;
  WallDuration shift;
  bool charsleftorpaused;
  WallTime horizon;
  Time translated;
  Time *time;
  uint32_t in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  TimePublisher *in_stack_ffffffffffffff30;
  TimeBase<miniros::Time,_miniros::Duration> *in_stack_ffffffffffffff38;
  TimeTranslator *in_stack_ffffffffffffff40;
  TimeBase<miniros::Time,_miniros::Duration> in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff67;
  byte bVar4;
  TimeBase<miniros::WallTime,_miniros::WallDuration> *this_00;
  TimeBase<miniros::Time,_miniros::Duration> local_78 [3];
  TimeBase<miniros::Time,_miniros::Duration> local_60;
  undefined8 local_58;
  TimeBase<miniros::Time,_miniros::Duration> in_stack_ffffffffffffffb8;
  WallTime local_3c;
  TimeBase<miniros::Time,_miniros::Duration> local_34;
  TimeBase<miniros::WallTime,_miniros::WallDuration> in_stack_ffffffffffffffe0;
  TimeBase<miniros::Time,_miniros::Duration> local_18;
  TimeBase<miniros::Time,_miniros::Duration> *local_10;
  
  rhs = TimePublisher::getTime((TimePublisher *)(in_RDI + 0x1f));
  this_00 = (TimeBase<miniros::WallTime,_miniros::WallDuration> *)&stack0xffffffffffffffe0;
  miniros::Duration::Duration
            ((Duration *)in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff38);
  local_18 = (TimeBase<miniros::Time,_miniros::Duration>)
             miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
                       (in_stack_ffffffffffffff38,(Duration *)in_stack_ffffffffffffff30);
  miniros::Duration::~Duration((Duration *)0x1bf147);
  local_10 = &local_18;
  local_34 = (TimeBase<miniros::Time,_miniros::Duration>)
             TimeTranslator::translate
                       (in_RDI,(Time *)CONCAT17(in_stack_ffffffffffffff67,
                                                CONCAT16(in_stack_ffffffffffffff66,
                                                         CONCAT24(in_stack_ffffffffffffff64,
                                                                  in_stack_ffffffffffffff60))));
  miniros::WallTime::WallTime
            ((WallTime *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
             in_stack_ffffffffffffff28);
  TimePublisher::setHorizon((TimePublisher *)(in_RDI + 0x1f),(Time *)local_10);
  TimePublisher::setWCHorizon((TimePublisher *)(in_RDI + 0x1f),&local_3c);
  if ((in_RDI[1].real_start_.super_TimeBase<miniros::Time,_miniros::Duration>.sec & 0x10000) != 0) {
    return;
  }
  *(undefined1 *)((long)&in_RDI[0x11].time_scale_ + 1) = 0;
  do {
    if (((ulong)in_RDI[0x11].time_scale_ & 1) == 0) {
      bVar1 = TimePublisher::horizonReached(in_stack_ffffffffffffff30);
      bVar4 = 0;
      if (!bVar1) goto LAB_001bf233;
    }
    else {
LAB_001bf233:
      bVar4 = miniros::NodeHandle::ok();
    }
    if ((bVar4 & 1) == 0) {
      return;
    }
    bVar1 = true;
    while( true ) {
      bVar3 = 0;
      if (bVar1) {
        bVar3 = miniros::NodeHandle::ok();
      }
      if ((bVar3 & 1) == 0) break;
      iVar2 = readCharFromStdin((Player *)in_stack_ffffffffffffffb8);
      if (iVar2 == -1) {
        if (((ulong)in_RDI[0x11].time_scale_ & 1) == 0) {
          bVar1 = false;
        }
        else {
          printTime((Player *)in_stack_ffffffffffffffe0);
          in_stack_ffffffffffffff40 = in_RDI + 0x1f;
          miniros::WallDuration::WallDuration
                    ((WallDuration *)in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff38);
          TimePublisher::runStalledClock
                    ((TimePublisher *)
                     CONCAT17(bVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff64,iVar2))),
                     (WallDuration *)in_stack_ffffffffffffff58);
          miniros::WallDuration::~WallDuration((WallDuration *)0x1bf47d);
          miniros::spinOnce();
        }
      }
      else if (iVar2 == 0x20) {
        *(byte *)&in_RDI[0x11].time_scale_ = (*(byte *)&in_RDI[0x11].time_scale_ ^ 0xff) & 1;
        if (((ulong)in_RDI[0x11].time_scale_ & 1) == 0) {
          local_58 = miniros::WallTime::now();
          miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator-
                    (this_00,(WallTime *)rhs);
          in_stack_ffffffffffffff58 =
               (TimeBase<miniros::Time,_miniros::Duration>)miniros::WallTime::now();
          in_RDI[0x12].real_start_.super_TimeBase<miniros::Time,_miniros::Duration> =
               in_stack_ffffffffffffff58;
          local_60 = in_stack_ffffffffffffff58;
          miniros::Duration::Duration
                    ((Duration *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff28);
          TimeTranslator::shift
                    ((TimeTranslator *)in_stack_ffffffffffffff30,
                     (Duration *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          miniros::Duration::~Duration((Duration *)0x1bf397);
          miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator+=
                    ((TimeBase<miniros::WallTime,_miniros::WallDuration> *)in_stack_ffffffffffffff40
                     ,(WallDuration *)in_stack_ffffffffffffff38);
          TimePublisher::setWCHorizon((TimePublisher *)(in_RDI + 0x1f),&local_3c);
          miniros::WallDuration::~WallDuration((WallDuration *)0x1bf3d6);
        }
        else {
          in_stack_ffffffffffffffb8 =
               (TimeBase<miniros::Time,_miniros::Duration>)miniros::WallTime::now();
          in_RDI[0x12].real_start_.super_TimeBase<miniros::Time,_miniros::Duration> =
               in_stack_ffffffffffffffb8;
        }
      }
    }
    printTime((Player *)in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffff30 = (TimePublisher *)(in_RDI + 0x1f);
    in_stack_ffffffffffffff38 = local_78;
    miniros::WallDuration::WallDuration
              ((WallDuration *)in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff38);
    TimePublisher::runClock(in_stack_00000010,in_stack_00000008);
    miniros::WallDuration::~WallDuration((WallDuration *)0x1bf502);
    miniros::spinOnce();
  } while( true );
}

Assistant:

void Player::doKeepAlive() {
    //Keep pushing ourself out in 10-sec increments (avoids fancy math dealing with the end of time)
    miniros::Time const& time = time_publisher_.getTime() + miniros::Duration(10.0);

    miniros::Time translated = time_translator_.translate(time);
    miniros::WallTime horizon = miniros::WallTime(translated.sec, translated.nsec);

    time_publisher_.setHorizon(time);
    time_publisher_.setWCHorizon(horizon);

    if (options_.at_once) {
        return;
    }

    // If we're done and just staying alive, don't watch the rate control topic. We aren't publishing anyway.
    delayed_ = false;

    while ((paused_ || !time_publisher_.horizonReached()) && node_handle_.ok())
    {
        bool charsleftorpaused = true;
        while (charsleftorpaused && node_handle_.ok())
        {
            switch (readCharFromStdin()){
            case ' ':
                paused_ = !paused_;
                if (paused_) {
                    paused_time_ = miniros::WallTime::now();
                }
                else
                {
                    // Make sure time doesn't shift after leaving pause.
                    miniros::WallDuration shift = miniros::WallTime::now() - paused_time_;
                    paused_time_ = miniros::WallTime::now();
         
                    time_translator_.shift(miniros::Duration(shift.sec, shift.nsec));

                    horizon += shift;
                    time_publisher_.setWCHorizon(horizon);
                }
                break;
            case EOF:
                if (paused_)
                {
                    printTime();
                    time_publisher_.runStalledClock(miniros::WallDuration(.1));
                    miniros::spinOnce();
                }
                else
                    charsleftorpaused = false;
            }
        }

        printTime();
        time_publisher_.runClock(miniros::WallDuration(.1));
        miniros::spinOnce();
    }
}